

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::PrototypeObject
               (Var prototypeProperty,RecyclableObject *constructorFunction,
               ScriptContext *scriptContext,RecyclableObject **prototypeObject)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicObject *pDVar6;
  RecyclableObject *this;
  
  if (prototypeProperty == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_009a1fab;
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(prototypeProperty);
  if ((ulong)prototypeProperty >> 0x32 == 0 && !bVar3) {
    this = UnsafeVarTo<Js::RecyclableObject>(prototypeProperty);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009a1fab;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if ((int)TVar1 < 0x17) goto LAB_009a1ea9;
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_009a1fab:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    pDVar6 = (DynamicObject *)VarTo<Js::RecyclableObject>(prototypeProperty);
    bVar3 = true;
  }
  else {
LAB_009a1ea9:
    pDVar6 = JavascriptLibraryBase::GetObjectPrototype
                       (&((((constructorFunction->type).ptr)->javascriptLibrary).ptr)->
                         super_JavascriptLibraryBase);
    bVar3 = false;
  }
  *prototypeObject = &pDVar6->super_RecyclableObject;
  return bVar3;
}

Assistant:

bool JavascriptOperators::PrototypeObject(Var prototypeProperty, RecyclableObject * constructorFunction, ScriptContext * scriptContext, RecyclableObject** prototypeObject)
    {
        TypeId prototypeType = JavascriptOperators::GetTypeId(prototypeProperty);

        if (JavascriptOperators::IsObjectType(prototypeType))
        {
            *prototypeObject = VarTo<RecyclableObject>(prototypeProperty);
            return true;
        }
        *prototypeObject = constructorFunction->GetLibrary()->GetObjectPrototype();
        return false;
    }